

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_GetFuncInfo(TA_FuncHandle *handle,TA_FuncInfo **funcInfo)

{
  TA_FuncDef *funcDef;
  TA_FuncInfo **funcInfo_local;
  TA_FuncHandle *handle_local;
  TA_RetCode local_4;
  
  if ((funcInfo == (TA_FuncInfo **)0x0) || (handle == (TA_FuncHandle *)0x0)) {
    local_4 = TA_BAD_PARAM;
  }
  else if (*handle == 0xa201b201) {
    *funcInfo = *(TA_FuncInfo **)(handle + 2);
    if (*(long *)(handle + 2) == 0) {
      local_4 = TA_INVALID_HANDLE;
    }
    else {
      local_4 = TA_SUCCESS;
    }
  }
  else {
    local_4 = TA_INVALID_HANDLE;
  }
  return local_4;
}

Assistant:

TA_RetCode TA_GetFuncInfo(  const TA_FuncHandle *handle,
                            const TA_FuncInfo **funcInfo )
{
   const TA_FuncDef *funcDef;

   if( !funcInfo || !handle )
   {
      return TA_BAD_PARAM;
   }

   /* Validate that this is a valid funcHandle. */
   funcDef = (const TA_FuncDef *)handle;
   if( funcDef->magicNumber != TA_FUNC_DEF_MAGIC_NB )
   {
      return TA_INVALID_HANDLE;
   }

   *funcInfo = funcDef->funcInfo;
   if( !funcDef->funcInfo )
      return TA_INVALID_HANDLE;

   return TA_SUCCESS;
}